

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O3

bool __thiscall
spvtools::val::BasicBlock::structurally_postdominates(BasicBlock *this,BasicBlock *other)

{
  _Any_data *p_Var1;
  function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)> *pfVar2;
  bool bVar3;
  BasicBlock *local_110;
  undefined1 local_108 [16];
  code *local_f8;
  _Manager_type local_f0;
  _Invoker_type p_Stack_e8;
  DominatorIterator local_e0;
  DominatorIterator local_b8;
  DominatorIterator local_90;
  DominatorIterator local_68;
  DominatorIterator local_40;
  
  if (this == other) {
    bVar3 = true;
  }
  else {
    DominatorIterator::DominatorIterator(&local_68);
    local_108._0_8_ = (void *)0x0;
    local_108._8_8_ = 0;
    local_f0 = std::
               _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
               ::_M_invoke;
    local_f8 = std::
               _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
               ::_M_manager;
    DominatorIterator::DominatorIterator
              (&local_b8,other,
               (function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)> *)
               local_108);
    if (local_f8 != (_Manager_type)0x0) {
      (*local_f8)(local_108,local_108,3);
    }
    DominatorIterator::DominatorIterator(&local_e0);
    p_Var1 = (_Any_data *)(local_108 + 8);
    local_108._0_8_ = local_b8.current_;
    local_108._8_8_ = 0;
    local_f8 = (_Manager_type)0x0;
    local_f0 = (_Manager_type)0x0;
    p_Stack_e8 = (_Invoker_type)0x0;
    local_110 = this;
    if (local_b8.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_b8.dom_func_.super__Function_base._M_manager)
                (p_Var1,(_Any_data *)&local_b8.dom_func_,__clone_functor);
      local_f0 = local_b8.dom_func_.super__Function_base._M_manager;
      p_Stack_e8 = local_b8.dom_func_._M_invoker;
    }
    pfVar2 = &local_40.dom_func_;
    local_40.current_ = local_e0.current_;
    local_40.dom_func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_40.dom_func_.super__Function_base._M_functor._8_8_ = 0;
    local_40.dom_func_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_40.dom_func_._M_invoker = (_Invoker_type)0x0;
    if (local_e0.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_e0.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)pfVar2,(_Any_data *)&local_e0.dom_func_,__clone_functor);
      local_40.dom_func_.super__Function_base._M_manager =
           local_e0.dom_func_.super__Function_base._M_manager;
      local_40.dom_func_._M_invoker = local_e0.dom_func_._M_invoker;
    }
    std::
    __find_if<spvtools::val::BasicBlock::DominatorIterator,__gnu_cxx::__ops::_Iter_equals_val<spvtools::val::BasicBlock_const*const>>
              (&local_90,(DominatorIterator *)local_108,&local_40,
               (_Iter_equals_val<const_spvtools::val::BasicBlock_*const>)&local_110);
    if (local_40.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_40.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
    }
    if (local_f0 != (_Manager_type)0x0) {
      (*local_f0)(p_Var1,p_Var1,__destroy_functor);
    }
    bVar3 = local_68.current_ != local_90.current_;
    if (local_90.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_90.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_90.dom_func_,(_Any_data *)&local_90.dom_func_,__destroy_functor
                );
    }
    if (local_e0.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_e0.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_e0.dom_func_,(_Any_data *)&local_e0.dom_func_,__destroy_functor
                );
    }
    if (local_b8.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_b8.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_b8.dom_func_,(_Any_data *)&local_b8.dom_func_,__destroy_functor
                );
    }
    if (local_68.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_68.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_68.dom_func_,(_Any_data *)&local_68.dom_func_,__destroy_functor
                );
    }
  }
  return bVar3;
}

Assistant:

bool BasicBlock::structurally_postdominates(const BasicBlock& other) const {
  return (this == &other) || !(other.structural_pdom_end() ==
                               std::find(other.structural_pdom_begin(),
                                         other.structural_pdom_end(), this));
}